

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::detail::ReferenceResolver::store_anchors_and_refs(ReferenceResolver *this)

{
  refdata *rd;
  size_t sVar1;
  refdata *prVar2;
  long lVar3;
  size_t sVar4;
  
  sVar1 = Tree::root_id(this->t);
  sVar1 = count_anchors_and_refs(this,sVar1);
  if (sVar1 != 0) {
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::reserve(&this->refs,sVar1);
    sVar1 = Tree::root_id(this->t);
    _store_anchors_and_refs(this,sVar1);
    prVar2 = (this->refs).m_stack;
    sVar1 = 0xffffffffffffffff;
    sVar4 = 0;
    for (lVar3 = (this->refs).m_size * 0x30; lVar3 != 0; lVar3 = lVar3 + -0x30) {
      prVar2->prev_anchor = sVar1;
      if (((prVar2->type).type & (VALANCH|KEYANCH)) != NOTYPE) {
        sVar1 = sVar4;
      }
      sVar4 = sVar4 + 1;
      prVar2 = prVar2 + 1;
    }
  }
  return;
}

Assistant:

void store_anchors_and_refs()
    {
        // minimize (re-)allocations by counting first
        size_t num_anchors_and_refs = count_anchors_and_refs(t->root_id());
        if(!num_anchors_and_refs)
            return;
        refs.reserve(num_anchors_and_refs);

        // now descend through the hierarchy
        _store_anchors_and_refs(t->root_id());

        // finally connect the reference list
        size_t prev_anchor = npos;
        size_t count = 0;
        for(auto &rd : refs)
        {
            rd.prev_anchor = prev_anchor;
            if(rd.type.is_anchor())
                prev_anchor = count;
            ++count;
        }
    }